

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_server.c
# Opt level: O0

void mk_server_launch_workers(mk_server *server)

{
  pthread_t local_20;
  pthread_t skip;
  mk_server *pmStack_10;
  int i;
  mk_server *server_local;
  
  pmStack_10 = server;
  for (skip._4_4_ = 0; skip._4_4_ < pmStack_10->workers; skip._4_4_ = skip._4_4_ + 1) {
    mk_sched_launch_thread(pmStack_10,&local_20);
  }
  return;
}

Assistant:

void mk_server_launch_workers(struct mk_server *server)
{
    int i;
    pthread_t skip;

    /* Launch workers */
    for (i = 0; i < server->workers; i++) {
        /* Spawn the thread */
        mk_sched_launch_thread(server, &skip);
    }
}